

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void P_ReadDemoWeaponsChunk(BYTE **demo)

{
  uint amount;
  PClassWeapon **ppPVar1;
  int *piVar2;
  char *name;
  PClass *p;
  PClassWeapon *key;
  char *s;
  PClassWeapon *type;
  int i;
  int count;
  BYTE **demo_local;
  
  amount = ReadWord(demo);
  TArray<PClassWeapon_*,_PClassWeapon_*>::Resize(&Weapons_ntoh,amount);
  TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::Clear
            (&Weapons_hton,amount);
  ppPVar1 = TArray<PClassWeapon_*,_PClassWeapon_*>::operator[](&Weapons_ntoh,0);
  *ppPVar1 = (PClassWeapon *)0x0;
  piVar2 = TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::operator[]
                     (&Weapons_hton,(PClassWeapon *)0x0);
  *piVar2 = 0;
  for (type._0_4_ = 1; (int)type < (int)amount; type._0_4_ = (int)type + 1) {
    name = ReadStringConst(demo);
    p = PClass::FindClass(name);
    key = dyn_cast<PClassWeapon>((DObject *)p);
    ppPVar1 = TArray<PClassWeapon_*,_PClassWeapon_*>::operator[](&Weapons_ntoh,(long)(int)type);
    *ppPVar1 = key;
    if (key != (PClassWeapon *)0x0) {
      piVar2 = TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::
               operator[](&Weapons_hton,key);
      *piVar2 = (int)type;
    }
  }
  return;
}

Assistant:

void P_ReadDemoWeaponsChunk(BYTE **demo)
{
	int count, i;
	PClassWeapon *type;
	const char *s;

	count = ReadWord(demo);
	Weapons_ntoh.Resize(count);
	Weapons_hton.Clear(count);

	Weapons_ntoh[0] = type = NULL;
	Weapons_hton[type] = 0;

	for (i = 1; i < count; ++i)
	{
		s = ReadStringConst(demo);
		type = dyn_cast<PClassWeapon>(PClass::FindClass(s));
		// If a demo was recorded with a weapon that is no longer present,
		// should we report it?
		Weapons_ntoh[i] = type;
		if (type != NULL)
		{
			Weapons_hton[type] = i;
		}
	}
}